

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypePrinter.cpp
# Opt level: O0

void __thiscall slang::ast::TypePrinter::TypePrinter(TypePrinter *this)

{
  TypePrintingOptions *in_RDI;
  
  TypePrintingOptions::TypePrintingOptions(in_RDI);
  std::make_unique<slang::FormatBuffer>();
  return;
}

Assistant:

TypePrinter::TypePrinter() : buffer(std::make_unique<FormatBuffer>()) {
}